

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::CopyImageToBuffer::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  ReadImplementation *this_00;
  WriteImplementation *this_01;
  DefaultDeleter<vkt::synchronization::Operation> local_36;
  DefaultDeleter<vkt::synchronization::Operation> local_35 [13];
  Resource *local_28;
  Resource *resource_local;
  OperationContext *context_local;
  Support *this_local;
  
  local_28 = resource;
  resource_local = (Resource *)context;
  context_local = (OperationContext *)this;
  this_local = (Support *)__return_storage_ptr__;
  if (this->m_mode == ACCESS_MODE_READ) {
    this_00 = (ReadImplementation *)operator_new(0x30);
    ReadImplementation::ReadImplementation(this_00,(OperationContext *)resource_local,local_28);
    de::DefaultDeleter<vkt::synchronization::Operation>::DefaultDeleter(local_35);
    de::details::
    MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>::
    MovePtr(__return_storage_ptr__,this_00);
  }
  else {
    this_01 = (WriteImplementation *)operator_new(0x70);
    WriteImplementation::WriteImplementation(this_01,(OperationContext *)resource_local,local_28);
    de::DefaultDeleter<vkt::synchronization::Operation>::DefaultDeleter(&local_36);
    de::details::
    MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>::
    MovePtr(__return_storage_ptr__,this_01);
  }
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		if (m_mode == ACCESS_MODE_READ)
			return de::MovePtr<Operation>(new ReadImplementation(context, resource));
		else
			return de::MovePtr<Operation>(new WriteImplementation(context, resource));
	}